

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O3

size_t stumpless_param_into_string(stumpless_param *param,char *str,size_t max_size)

{
  size_t __n;
  size_t __n_00;
  char *__src;
  ulong uVar1;
  char *pcVar2;
  char *name;
  
  if (param == (stumpless_param *)0x0) {
    pcVar2 = "param was NULL";
  }
  else {
    if (str != (char *)0x0) {
      pthread_lock_mutex((pthread_mutex_t *)param->mutex);
      __n = param->name_length;
      __n_00 = param->value_length;
      uVar1 = __n_00 + 4 + __n;
      if (max_size < uVar1) {
        raise_argument_too_small
                  ("buffer is too small for the given message",max_size,
                   "buffer used to store the message");
      }
      else {
        __src = param->value;
        memcpy(str,param,__n);
        pcVar2 = str + __n;
        pcVar2[0] = '=';
        pcVar2[1] = '\"';
        memcpy(pcVar2 + 2,__src,__n_00);
        (str + __n_00 + 2 + __n)[0] = '\"';
        (str + __n_00 + 2 + __n)[1] = '\0';
      }
      pthread_unlock_mutex((pthread_mutex_t *)param->mutex);
      return uVar1;
    }
    pcVar2 = "str was NULL";
  }
  raise_argument_empty(pcVar2);
  return 0;
}

Assistant:

size_t
stumpless_param_into_string( const struct stumpless_param *param, char *str, size_t max_size ) {
  size_t min_buff_size;

  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( param );
  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( str );

  lock_param( param );

  min_buff_size = locked_get_param_string_size( param );
  if ( min_buff_size > max_size ) {
    raise_argument_too_small( L10N_BUFFER_TOO_SMALL_ERROR_MESSAGE,
                              max_size,
                              L10N_BUFFER_SIZE_ERROR_CODE_TYPE );
    goto fail;
  }
  
  min_buff_size = locked_param_into_buffer( param, str, max_size );

  unlock_param( param );

  return min_buff_size;

fail:
  unlock_param( param );
  return min_buff_size;
}